

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string___GetSubstitution(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint uVar1;
  JSString *p;
  uint32_t uVar2;
  int iVar3;
  uint to;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int64_t iVar9;
  JSValueUnion JVar10;
  uint uVar11;
  uint32_t from;
  uint from_00;
  ulong uVar12;
  JSValue v;
  JSValue this_obj;
  JSValue obj;
  JSValue JVar13;
  JSValue JVar14;
  JSValue obj_00;
  uint32_t captures_len;
  uint32_t local_a0;
  uint32_t local_9c;
  uint32_t matched_len;
  uint32_t position;
  ulong local_90;
  int64_t local_88;
  JSValueUnion local_80;
  JSString *local_78;
  int64_t local_70;
  JSValueUnion local_68;
  StringBuffer local_60;
  ulong local_40;
  JSValueUnion local_38;
  
  JVar10 = this_val.u;
  if ((*(int *)((long)JVar10.ptr + 0x58) == -7) && (*(int *)((long)JVar10.ptr + 0x18) == -7)) {
    local_68 = *JVar10.ptr;
    local_70 = *(int64_t *)((long)JVar10.ptr + 8);
    local_78 = *(JSString **)((long)JVar10.ptr + 0x10);
    local_80 = (JSValueUnion)((JSValueUnion *)((long)JVar10.ptr + 0x30))->ptr;
    iVar9 = *(int64_t *)((long)JVar10.ptr + 0x38);
    local_38 = *(JSValueUnion *)((long)JVar10.ptr + 0x40);
    local_90 = *(ulong *)((long)JVar10.ptr + 0x48);
    p = *(JSString **)((long)JVar10.ptr + 0x50);
    string_buffer_init(ctx,&local_60,0);
    captures_len = 0;
    local_88 = iVar9;
    if (((((int)iVar9 == 3) ||
         (JVar14.tag = iVar9, JVar14.u.float64 = local_80.float64,
         iVar3 = js_get_length32(ctx,&captures_len,JVar14), iVar3 == 0)) &&
        (obj_00.tag = local_70, obj_00.u.float64 = local_68.float64,
        iVar3 = js_get_length32(ctx,&matched_len,obj_00), iVar3 == 0)) &&
       (iVar3 = JS_ToInt32(ctx,(int32_t *)&position,*(JSValue *)((long)JVar10.ptr + 0x20)),
       uVar2 = captures_len, -1 < iVar3)) {
      uVar6 = *(uint *)&p->field_0x4 & 0x7fffffff;
      local_9c = position;
      local_a0 = matched_len + position;
      local_40 = local_90 & 0xffffffff;
      uVar8 = 0;
LAB_0013811a:
      do {
        from = (uint32_t)uVar8;
        to = string_indexof_char(p,0x24,from);
        if ((int)to < 0) {
LAB_00138342:
          string_buffer_concat(&local_60,p,from,*(uint *)&p->field_0x4 & 0x7fffffff);
          JVar14 = string_buffer_end(&local_60);
          iVar9 = JVar14.tag;
          uVar8 = (ulong)JVar14.u.ptr & 0xffffffff00000000;
          uVar12 = (ulong)JVar14.u._0_4_;
          goto LAB_001380b4;
        }
        uVar12 = (ulong)to;
        if (uVar6 <= (uint)(uVar12 + 1)) goto LAB_00138342;
        string_buffer_concat(&local_60,p,from,to);
        iVar3 = (int)*(undefined8 *)&p->field_0x4;
        if (iVar3 < 0) {
          uVar7 = (uint)*(ushort *)((long)&p[1].header.ref_count + uVar12 * 2 + 2);
        }
        else {
          uVar7 = (uint)*(byte *)((long)&p[1].header.ref_count + uVar12 + 1);
        }
        uVar8 = uVar12 + 2;
        if (uVar7 == 0x60) {
          string_buffer_concat(&local_60,local_78,0,local_9c);
          goto LAB_0013811a;
        }
        if (uVar7 != 0x26) {
          if (uVar7 != 0x27) {
            if (uVar7 == 0x24) {
              string_buffer_putc8(&local_60,0x24);
              goto LAB_0013811a;
            }
            uVar5 = uVar7 - 0x30;
            from_00 = (uint)uVar8;
            if (uVar5 < 10) {
              if (from_00 < uVar6) {
                if (iVar3 < 0) {
                  uVar7 = (uint)*(ushort *)(&p[1].field_0x4 + uVar12 * 2);
                }
                else {
                  uVar7 = (uint)*(byte *)((long)&p[1].header.ref_count + uVar8);
                }
                if (uVar7 - 0x30 < 10) {
                  uVar7 = uVar7 + uVar5 * 10;
                  uVar1 = uVar7 - 0x30;
                  uVar11 = to + 3;
                  if (uVar7 < 0x31 || uVar2 <= uVar1) {
                    uVar11 = from_00;
                    uVar1 = uVar5;
                  }
                  uVar5 = uVar1;
                  uVar8 = (ulong)uVar11;
                }
              }
              if (uVar5 < uVar2 && uVar5 != 0) {
                obj.tag = local_88;
                obj.u.float64 = local_80.float64;
                JVar14 = JS_GetPropertyInt64(ctx,obj,(ulong)uVar5);
                if ((int)JVar14.tag != 3) {
                  if ((int)JVar14.tag != 6) {
                    iVar3 = string_buffer_concat_value_free(&local_60,JVar14);
                    goto LAB_001381a8;
                  }
                  break;
                }
                goto LAB_0013811a;
              }
            }
            else if ((uVar7 == 0x3c && local_40 != 3) &&
                    (iVar3 = string_indexof_char(p,0x3e,from_00), -1 < iVar3)) {
              JVar14 = js_sub_string(ctx,p,from_00,iVar3);
              if ((int)JVar14.tag == 6) break;
              this_obj.tag = local_90;
              this_obj.u.float64 = local_38.float64;
              JVar14 = JS_GetPropertyValue(ctx,this_obj,JVar14);
              if (((int)JVar14.tag != 3) &&
                 (((int)JVar14.tag == 6 ||
                  (iVar4 = string_buffer_concat_value_free(&local_60,JVar14), iVar4 != 0)))) break;
              uVar8 = (ulong)(iVar3 + 1);
              goto LAB_0013811a;
            }
            string_buffer_concat(&local_60,p,to,(uint32_t)uVar8);
            goto LAB_0013811a;
          }
          string_buffer_concat
                    (&local_60,local_78,local_a0,*(uint *)&local_78->field_0x4 & 0x7fffffff);
          goto LAB_0013811a;
        }
        v.tag = local_70;
        v.u.float64 = local_68.float64;
        iVar3 = string_buffer_concat_value(&local_60,v);
LAB_001381a8:
      } while (iVar3 == 0);
    }
    (*((local_60.ctx)->rt->mf).js_free)(&(local_60.ctx)->rt->malloc_state,local_60.str);
  }
  else {
    JS_ThrowTypeError(ctx,"not a string");
  }
  iVar9 = 6;
  uVar12 = 0;
  uVar8 = 0;
LAB_001380b4:
  JVar13.tag = iVar9;
  JVar13.u.ptr = (void *)(uVar12 | uVar8);
  return JVar13;
}

Assistant:

static JSValue js_string___GetSubstitution(JSContext *ctx, JSValueConst this_val,
                                           int argc, JSValueConst *argv)
{
    // GetSubstitution(matched, str, position, captures, namedCaptures, rep)
    JSValueConst matched, str, captures, namedCaptures, rep;
    JSValue capture, name, s;
    uint32_t position, len, matched_len, captures_len;
    int i, j, j0, k, k1;
    int c, c1;
    StringBuffer b_s, *b = &b_s;
    JSString *sp, *rp;

    matched = argv[0];
    str = argv[1];
    captures = argv[3];
    namedCaptures = argv[4];
    rep = argv[5];

    if (!JS_IsString(rep) || !JS_IsString(str))
        return JS_ThrowTypeError(ctx, "not a string");

    sp = JS_VALUE_GET_STRING(str);
    rp = JS_VALUE_GET_STRING(rep);

    string_buffer_init(ctx, b, 0);

    captures_len = 0;
    if (!JS_IsUndefined(captures)) {
        if (js_get_length32(ctx, &captures_len, captures))
            goto exception;
    }
    if (js_get_length32(ctx, &matched_len, matched))
        goto exception;
    if (JS_ToUint32(ctx, &position, argv[2]) < 0)
        goto exception;

    len = rp->len;
    i = 0;
    for(;;) {
        j = string_indexof_char(rp, '$', i);
        if (j < 0 || j + 1 >= len)
            break;
        string_buffer_concat(b, rp, i, j);
        j0 = j++;
        c = string_get(rp, j++);
        if (c == '$') {
            string_buffer_putc8(b, '$');
        } else if (c == '&') {
            if (string_buffer_concat_value(b, matched))
                goto exception;
        } else if (c == '`') {
            string_buffer_concat(b, sp, 0, position);
        } else if (c == '\'') {
            string_buffer_concat(b, sp, position + matched_len, sp->len);
        } else if (c >= '0' && c <= '9') {
            k = c - '0';
            if (j < len) {
                c1 = string_get(rp, j);
                if (c1 >= '0' && c1 <= '9') {
                    /* This behavior is specified in ES6 and refined in ECMA 2019 */
                    /* ECMA 2019 does not have the extra test, but
                       Test262 S15.5.4.11_A3_T1..3 require this behavior */
                    k1 = k * 10 + c1 - '0';
                    if (k1 >= 1 && k1 < captures_len) {
                        k = k1;
                        j++;
                    }
                }
            }
            if (k >= 1 && k < captures_len) {
                s = JS_GetPropertyInt64(ctx, captures, k);
                if (JS_IsException(s))
                    goto exception;
                if (!JS_IsUndefined(s)) {
                    if (string_buffer_concat_value_free(b, s))
                        goto exception;
                }
            } else {
                goto norep;
            }
        } else if (c == '<' && !JS_IsUndefined(namedCaptures)) {
            k = string_indexof_char(rp, '>', j);
            if (k < 0)
                goto norep;
            name = js_sub_string(ctx, rp, j, k);
            if (JS_IsException(name))
                goto exception;
            capture = JS_GetPropertyValue(ctx, namedCaptures, name);
            if (JS_IsException(capture))
                goto exception;
            if (!JS_IsUndefined(capture)) {
                if (string_buffer_concat_value_free(b, capture))
                    goto exception;
            }
            j = k + 1;
        } else {
        norep:
            string_buffer_concat(b, rp, j0, j);
        }
        i = j;
    }
    string_buffer_concat(b, rp, i, rp->len);
    return string_buffer_end(b);
exception:
    string_buffer_free(b);
    return JS_EXCEPTION;
}